

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_cube_wires(rf_vec3 position,float width,float height,float length,rf_color color)

{
  _Bool _Var1;
  float x;
  float x_00;
  float y;
  float y_00;
  float z;
  float z_00;
  undefined4 local_38;
  undefined4 uStack_34;
  
  _Var1 = rf_gfx_check_buffer_limit(0x24);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_38 = position.x;
  uStack_34 = position.y;
  rf_gfx_translatef(local_38,uStack_34,position.z);
  rf_gfx_begin(RF_LINES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  x_00 = 0.0 - width * 0.5;
  y = 0.0 - height * 0.5;
  z = length * 0.5 + 0.0;
  rf_gfx_vertex3f(x_00,y,z);
  x = width * 0.5 + 0.0;
  rf_gfx_vertex3f(x,y,z);
  rf_gfx_vertex3f(x,y,z);
  y_00 = height * 0.5 + 0.0;
  rf_gfx_vertex3f(x,y_00,z);
  rf_gfx_vertex3f(x,y_00,z);
  rf_gfx_vertex3f(x_00,y_00,z);
  rf_gfx_vertex3f(x_00,y_00,z);
  rf_gfx_vertex3f(x_00,y,z);
  z_00 = 0.0 - length * 0.5;
  rf_gfx_vertex3f(x_00,y,z_00);
  rf_gfx_vertex3f(x,y,z_00);
  rf_gfx_vertex3f(x,y,z_00);
  rf_gfx_vertex3f(x,y_00,z_00);
  rf_gfx_vertex3f(x,y_00,z_00);
  rf_gfx_vertex3f(x_00,y_00,z_00);
  rf_gfx_vertex3f(x_00,y_00,z_00);
  rf_gfx_vertex3f(x_00,y,z_00);
  rf_gfx_vertex3f(x_00,y_00,z);
  rf_gfx_vertex3f(x_00,y_00,z_00);
  rf_gfx_vertex3f(x,y_00,z);
  rf_gfx_vertex3f(x,y_00,z_00);
  rf_gfx_vertex3f(x_00,y,z);
  rf_gfx_vertex3f(x_00,y,z_00);
  rf_gfx_vertex3f(x,y,z);
  rf_gfx_vertex3f(x,y,z_00);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_cube_wires(rf_vec3 position, float width, float height, float length, rf_color color)
{
    float x = 0.0f;
    float y = 0.0f;
    float z = 0.0f;

    if (rf_gfx_check_buffer_limit(36)) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(position.x, position.y, position.z);

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    // Front Face -----------------------------------------------------
    // Bottom Line
    rf_gfx_vertex3f(x-width/2, y-height/2, z+length/2); // Bottom Left
    rf_gfx_vertex3f(x+width/2, y-height/2, z+length/2); // Bottom Right

    // Left Line
    rf_gfx_vertex3f(x+width/2, y-height/2, z+length/2); // Bottom Right
    rf_gfx_vertex3f(x+width/2, y+height/2, z+length/2); // Top Right

    // Top Line
    rf_gfx_vertex3f(x+width/2, y+height/2, z+length/2); // Top Right
    rf_gfx_vertex3f(x-width/2, y+height/2, z+length/2); // Top Left

    // Right Line
    rf_gfx_vertex3f(x-width/2, y+height/2, z+length/2); // Top Left
    rf_gfx_vertex3f(x-width/2, y-height/2, z+length/2); // Bottom Left

    // Back Face ------------------------------------------------------
    // Bottom Line
    rf_gfx_vertex3f(x-width/2, y-height/2, z-length/2); // Bottom Left
    rf_gfx_vertex3f(x+width/2, y-height/2, z-length/2); // Bottom Right

    // Left Line
    rf_gfx_vertex3f(x+width/2, y-height/2, z-length/2); // Bottom Right
    rf_gfx_vertex3f(x+width/2, y+height/2, z-length/2); // Top Right

    // Top Line
    rf_gfx_vertex3f(x+width/2, y+height/2, z-length/2); // Top Right
    rf_gfx_vertex3f(x-width/2, y+height/2, z-length/2); // Top Left

    // Right Line
    rf_gfx_vertex3f(x-width/2, y+height/2, z-length/2); // Top Left
    rf_gfx_vertex3f(x-width/2, y-height/2, z-length/2); // Bottom Left

    // Top Face -------------------------------------------------------
    // Left Line
    rf_gfx_vertex3f(x-width/2, y+height/2, z+length/2); // Top Left Front
    rf_gfx_vertex3f(x-width/2, y+height/2, z-length/2); // Top Left Back

    // Right Line
    rf_gfx_vertex3f(x+width/2, y+height/2, z+length/2); // Top Right Front
    rf_gfx_vertex3f(x+width/2, y+height/2, z-length/2); // Top Right Back

    // Bottom Face  ---------------------------------------------------
    // Left Line
    rf_gfx_vertex3f(x-width/2, y-height/2, z+length/2); // Top Left Front
    rf_gfx_vertex3f(x-width/2, y-height/2, z-length/2); // Top Left Back

    // Right Line
    rf_gfx_vertex3f(x+width/2, y-height/2, z+length/2); // Top Right Front
    rf_gfx_vertex3f(x+width/2, y-height/2, z-length/2); // Top Right Back
    rf_gfx_end();
    rf_gfx_pop_matrix();
}